

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadCame_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  Node *msh;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  short sVar4;
  Camera *this_00;
  _Elt_pointer psVar5;
  ChunkInfo *pCVar6;
  COBImporter *this_01;
  chunk_guard cn;
  element_type *local_48;
  undefined1 auStack_40 [8];
  shared_ptr<Assimp::COB::Node> local_38;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Came");
    return;
  }
  cn.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar6 = nfo;
  cn.nfo = nfo;
  cn.reader = reader;
  this_00 = (Camera *)operator_new(0xd8);
  COB::Camera::Camera(this_00);
  std::__shared_ptr<Assimp::COB::Camera,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::COB::Camera,void>
            ((__shared_ptr<Assimp::COB::Camera,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_00);
  this_01 = (COBImporter *)auStack_40;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_40;
  local_48 = (element_type *)0x0;
  auStack_40 = (undefined1  [8])0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
  psVar5 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar5 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar6 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar5 = (_Elt_pointer)(*(long *)&pCVar6[-1].version + 0x200);
  }
  msh = psVar5[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar1;
  (msh->super_ChunkInfo).version = uVar2;
  (msh->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary(this_01,msh,reader,pCVar6);
  if (1 < nfo->version) {
    sVar4 = StreamReader<false,_false>::Get<short>(reader);
    if (sVar4 == 0x200) {
      StreamReader<false,_false>::IncPtr(reader,0x2a);
    }
  }
  chunk_guard::~chunk_guard(&cn);
  return;
}

Assistant:

void COBImporter::ReadCame_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Came");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Camera>(new Camera()));
    Camera& msh = (Camera&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    // the rest is not interesting for us, so we skip over it.
    if(nfo.version > 1) {
        if (reader.GetI2()==512) {
            reader.IncPtr(42);
        }
    }
}